

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O1

void __thiscall gpu::shared_device_buffer::decref(shared_device_buffer *this)

{
  long *plVar1;
  string local_58;
  string local_38;
  
  plVar1 = (long *)this->buffer_;
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      if (this->type_ == 1) {
        clReleaseMemObject((cl_mem)this->data_);
      }
      else {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                   ,"");
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"No GPU context!","");
        raiseException(&local_38,0x6a,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p);
        }
      }
      if (this->buffer_ != (uchar *)0x0) {
        operator_delete__(this->buffer_);
      }
    }
    this->buffer_ = (uchar *)0x0;
    this->data_ = (void *)0x0;
    this->type_ = 0;
    this->size_ = 0;
    this->offset_ = 0;
  }
  return;
}

Assistant:

void shared_device_buffer::decref()
{
	if (!buffer_)
		return;

	long long count = 0;

#if defined(_WIN64)
	count = InterlockedDecrement64((LONGLONG *) buffer_);
#elif defined(_WIN32)
	count = InterlockedDecrement((LONG *) buffer_);
#else
	count = __sync_sub_and_fetch((long long *) buffer_, 1);
#endif

	if (!count) {
		switch (type_) {
#ifdef CUDA_SUPPORT
		case Context::TypeCUDA:
			cudaFree(data_);
			break;
#endif
		case Context::TypeOpenCL:
			clReleaseMemObject((cl_mem) data_);
			break;
		default:
			gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
		}

		delete [] buffer_;
	}

	buffer_ = 0;
	data_	= 0;
	type_	= Context::TypeUndefined;
	size_	= 0;
	offset_	= 0;
}